

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::
     HandleDecimal<duckdb::DecimalCastData<duckdb::hugeint_t>,true,true>
               (DecimalCastData<duckdb::hugeint_t> *state,uint8_t digit)

{
  byte bVar1;
  hugeint_t hVar2;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  
  bVar1 = state->decimal_count;
  if ((bVar1 == state->scale) && (state->round_set == false)) {
    state->round_set = true;
    state->should_round = 4 < digit;
  }
  if ((uint)state->digit_count + (uint)bVar1 < 0x26) {
    state->decimal_count = bVar1 + 1;
    hugeint_t::hugeint_t(&local_40,10);
    local_30 = hugeint_t::operator*(&state->result,&local_40);
    hugeint_t::hugeint_t(&local_50,(ulong)digit);
    hVar2 = hugeint_t::operator-(&local_30,&local_50);
    (state->result).lower = hVar2.lower;
    (state->result).upper = hVar2.upper;
  }
  return true;
}

Assistant:

static bool HandleDecimal(T &state, uint8_t digit) {
		if (state.decimal_count == state.scale && !state.round_set) {
			// Determine whether the last registered decimal should be rounded or not
			state.round_set = true;
			state.should_round = digit >= 5;
		}
		if (!ALLOW_EXPONENT && state.decimal_count == state.scale) {
			// we exceeded the amount of supported decimals
			// however, we don't throw an error here
			// we just truncate the decimal
			return true;
		}
		//! If we expect an exponent, we need to preserve the decimals
		//! But we don't want to overflow, so we prevent overflowing the result with this check
		if (state.digit_count + state.decimal_count >= DecimalWidth<decltype(state.result)>::max) {
			return true;
		}
		state.decimal_count++;
		if (NEGATIVE) {
			state.result = state.result * 10 - digit;
		} else {
			state.result = state.result * 10 + digit;
		}
		return true;
	}